

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall ON_SubDLevel::UpdateVertexTags(ON_SubDLevel *this,bool bUnsetVertexTagsOnly)

{
  ON_SubDVertexTag OVar1;
  ON_SubDVertex *pOVar2;
  ON_SubDVertexTag OVar3;
  ON_SubDVertexTag vertex_tag1;
  ON_SubDVertex *pOStack_28;
  ON_SubDVertexTag vertex_tag0;
  ON_SubDVertex *vertex;
  ON_SubDVertex *next_vertex;
  uint vertex_change_count;
  bool bUnsetVertexTagsOnly_local;
  ON_SubDLevel *this_local;
  
  next_vertex._0_4_ = 0;
  pOVar2 = this->m_vertex[0];
  while (pOStack_28 = pOVar2, pOStack_28 != (ON_SubDVertex *)0x0) {
    pOVar2 = pOStack_28->m_next_vertex;
    OVar1 = pOStack_28->m_vertex_tag;
    if ((((!bUnsetVertexTagsOnly) || (OVar1 == Unset)) &&
        (OVar3 = ON_SubDVertex::SuggestedVertexTag(pOStack_28,true,false), OVar3 != Unset)) &&
       (OVar1 != OVar3)) {
      pOStack_28->m_vertex_tag = OVar3;
      next_vertex._0_4_ = (uint)next_vertex + 1;
    }
  }
  return (uint)next_vertex;
}

Assistant:

unsigned int ON_SubDLevel::UpdateVertexTags(
  bool bUnsetVertexTagsOnly
  )
{
  // Update edge flags and sector coefficients.
  unsigned int vertex_change_count = 0;
 

  ON_SubDVertex* next_vertex = m_vertex[0];
  for (ON_SubDVertex* vertex = next_vertex; nullptr != vertex; vertex = next_vertex)
  {
    next_vertex = const_cast<ON_SubDVertex*>(vertex->m_next_vertex);

    const ON_SubDVertexTag vertex_tag0 = vertex->m_vertex_tag;
    if (bUnsetVertexTagsOnly && ON_SubDVertexTag::Unset != vertex_tag0 )
    {
      continue;
    }

    const ON_SubDVertexTag vertex_tag1 = vertex->SuggestedVertexTag(true, false);
    if (ON_SubDVertexTag::Unset == vertex_tag1)
      continue;

    if ( vertex_tag0 != vertex_tag1)
    {
      vertex->m_vertex_tag = vertex_tag1;
      vertex_change_count++;
    }
  }

  return vertex_change_count;
}